

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqlfield.cpp
# Opt level: O1

void QSqlField::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QVariant *pQVar1;
  long lVar2;
  QArrayData *pQVar3;
  byte bVar4;
  undefined4 uVar5;
  PrivateShared *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long in_FS_OFFSET;
  QVariant QStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == WriteProperty) {
    if ((uint)_id < 0xb) {
      pQVar1 = (QVariant *)*_a;
      switch(_id) {
      case 0:
        if ((*(byte *)(*(long *)(_o + 0x20) + 0x70) & 1) == 0) {
          QVariant::operator=((QVariant *)_o,pQVar1);
        }
        break;
      case 1:
        setDefaultValue((QSqlField *)_o,pQVar1);
        break;
      case 2:
        setName((QSqlField *)_o,(QString *)pQVar1);
        break;
      case 3:
        setTableName((QSqlField *)_o,(QString *)pQVar1);
        break;
      case 4:
        setMetaType((QSqlField *)_o,(QMetaTypeInterface *)(pQVar1->d).data.shared);
        break;
      case 5:
        uVar5 = *(undefined4 *)&(pQVar1->d).data;
        if ((*(int **)(_o + 0x20) != (int *)0x0) && (**(int **)(_o + 0x20) != 1)) {
          QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper
                    ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)(_o + 0x20));
        }
        *(undefined4 *)((long)*(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20) + 0x60) =
             uVar5;
        break;
      case 6:
        setReadOnly((QSqlField *)_o,(bool)(pQVar1->d).data.data[0]);
        break;
      case 7:
        setGenerated((QSqlField *)_o,(bool)(pQVar1->d).data.data[0]);
        break;
      case 8:
        setAutoValue((QSqlField *)_o,(bool)(pQVar1->d).data.data[0]);
        break;
      case 9:
        uVar5 = *(undefined4 *)&(pQVar1->d).data;
        if ((*(int **)(_o + 0x20) != (int *)0x0) && (**(int **)(_o + 0x20) != 1)) {
          QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper
                    ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)(_o + 0x20));
        }
        *(undefined4 *)((long)*(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20) + 100) =
             uVar5;
        break;
      case 10:
        uVar5 = *(undefined4 *)&(pQVar1->d).data;
        if ((*(int **)(_o + 0x20) != (int *)0x0) && (**(int **)(_o + 0x20) != 1)) {
          QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper
                    ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)(_o + 0x20));
        }
        *(undefined4 *)((long)*(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20) + 0x68) =
             uVar5;
      }
    }
    goto LAB_00121d05;
  }
  if ((_c != ReadProperty) || (10 < (uint)_id)) goto LAB_00121d05;
  pQVar1 = (QVariant *)*_a;
  switch(_id) {
  case 0:
    goto LAB_00121bad;
  case 1:
    _o = (QObject *)(*(long *)(_o + 0x20) + 0x38);
LAB_00121bad:
    QVariant::QVariant(&QStack_58,(QVariant *)_o);
    QVariant::operator=(pQVar1,&QStack_58);
    QVariant::~QVariant(&QStack_58);
    goto LAB_00121d05;
  case 2:
    lVar2 = *(long *)(_o + 0x20);
    pPVar6 = *(PrivateShared **)(lVar2 + 8);
    uVar7 = *(undefined8 *)(lVar2 + 0x10);
    uVar8 = *(undefined8 *)(lVar2 + 0x18);
    goto LAB_00121b5f;
  case 3:
    lVar2 = *(long *)(_o + 0x20);
    pPVar6 = *(PrivateShared **)(lVar2 + 0x20);
    uVar7 = *(undefined8 *)(lVar2 + 0x28);
    uVar8 = *(undefined8 *)(lVar2 + 0x30);
LAB_00121b5f:
    if (pPVar6 != (PrivateShared *)0x0) {
      LOCK();
      *(int *)pPVar6 = *(int *)pPVar6 + 1;
      UNLOCK();
    }
    pQVar3 = (QArrayData *)(pQVar1->d).data.shared;
    (pQVar1->d).data.shared = pPVar6;
    *(undefined8 *)((long)&(pQVar1->d).data + 8) = uVar7;
    *(undefined8 *)((long)&(pQVar1->d).data + 0x10) = uVar8;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    goto LAB_00121d05;
  case 4:
    (pQVar1->d).data.shared = *(PrivateShared **)(*(long *)(_o + 0x20) + 0x58);
    goto LAB_00121d05;
  case 5:
    uVar5 = *(undefined4 *)(*(long *)(_o + 0x20) + 0x60);
    break;
  case 6:
    bVar4 = *(byte *)(*(long *)(_o + 0x20) + 0x70);
    goto LAB_00121bf0;
  case 7:
    bVar4 = *(byte *)(*(long *)(_o + 0x20) + 0x70) >> 1;
    goto LAB_00121bf0;
  case 8:
    bVar4 = *(byte *)(*(long *)(_o + 0x20) + 0x70) >> 2;
LAB_00121bf0:
    (pQVar1->d).data.data[0] = bVar4 & 1;
    goto LAB_00121d05;
  case 9:
    uVar5 = *(undefined4 *)(*(long *)(_o + 0x20) + 100);
    break;
  case 10:
    uVar5 = *(undefined4 *)(*(long *)(_o + 0x20) + 0x68);
  }
  *(undefined4 *)&(pQVar1->d).data = uVar5;
LAB_00121d05:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlField::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QSqlField *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVariant*>(_v) = _t->value(); break;
        case 1: *reinterpret_cast<QVariant*>(_v) = _t->defaultValue(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->name(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->tableName(); break;
        case 4: *reinterpret_cast<QMetaType*>(_v) = _t->metaType(); break;
        case 5: *reinterpret_cast<RequiredStatus*>(_v) = _t->requiredStatus(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->isGenerated(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isAutoValue(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->length(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->precision(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 1: _t->setDefaultValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 2: _t->setName(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setTableName(*reinterpret_cast<QString*>(_v)); break;
        case 4: _t->setMetaType(*reinterpret_cast<QMetaType*>(_v)); break;
        case 5: _t->setRequiredStatus(*reinterpret_cast<RequiredStatus*>(_v)); break;
        case 6: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setGenerated(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setAutoValue(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setLength(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setPrecision(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}